

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

int gray_convert_glyph_inner(PWorker worker)

{
  long lVar1;
  PVG_FT_Pos *pPVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  PVG_FT_Pos *pPVar7;
  long lVar8;
  PVG_FT_Vector *pPVar9;
  PVG_FT_Vector *pPVar10;
  long ex;
  PVG_FT_Vector *pPVar11;
  char *pcVar12;
  long lVar13;
  int error;
  PVG_FT_Vector v_control;
  PVG_FT_Vector vec;
  PVG_FT_Vector v_middle;
  int local_a0;
  PVG_FT_Vector local_98;
  PVG_FT_Vector local_88;
  long local_78;
  PVG_FT_Vector local_70;
  PVG_FT_Vector local_60;
  long local_50;
  TPos local_48;
  PVG_FT_Vector local_40;
  
  iVar3 = _setjmp((__jmp_buf_tag *)worker->jump_buffer);
  if (iVar3 == 0) {
    if ((worker->outline).n_contours < 1) {
      local_a0 = 0;
    }
    else {
      uVar4 = 0;
      lVar8 = 0;
      do {
        lVar13 = (long)(worker->outline).contours[lVar8];
        iVar3 = 5;
        if (-1 < lVar13) {
          pPVar10 = (worker->outline).points;
          local_98.x = pPVar10[uVar4].x;
          local_98.y = pPVar10[uVar4].y;
          local_88.x = pPVar10[uVar4].x;
          local_88.y = pPVar10[uVar4].y;
          pcVar12 = (worker->outline).tags;
          if ((pcVar12[uVar4] & 3U) != 2) {
            pPVar11 = pPVar10 + lVar13;
            pPVar9 = pPVar10 + uVar4;
            pcVar5 = pcVar12 + uVar4;
            if ((pcVar12[uVar4] & 3U) == 0) {
              if ((pcVar12[lVar13] & 3U) == 1) {
                pPVar11 = pPVar11 + -1;
                local_98.x = pPVar10[lVar13].x;
                local_98.y = pPVar10[lVar13].y;
              }
              else {
                local_98.x = (pPVar10[lVar13].x + local_98.x) / 2;
                local_98.y = (pPVar10[lVar13].y + local_98.y) / 2;
              }
              pPVar9 = pPVar9 + -1;
              pcVar5 = pcVar5 + -1;
            }
            local_78 = lVar8;
            local_50 = lVar13;
            if (worker->invalid == 0) {
              gray_record_cell(worker);
            }
            lVar8 = local_98.x * 4;
            lVar13 = local_98.y * 4;
            lVar1 = worker->min_ex;
            lVar6 = local_98.x >> 6;
            if (worker->max_ex < local_98.x >> 6) {
              lVar6 = worker->max_ex;
            }
            ex = lVar1 + -1;
            if (lVar1 <= lVar6) {
              ex = lVar6;
            }
            worker->area = 0;
            worker->cover = 0;
            worker->invalid = 0;
            worker->ex = ex - lVar1;
            worker->ey = (local_98.y >> 6) - worker->min_ey;
            gray_set_cell(worker,ex,local_98.y >> 6);
            worker->x = lVar8;
            worker->y = lVar13;
            local_48 = lVar8;
            do {
              while( true ) {
                while( true ) {
                  if (pPVar11 <= pPVar9) {
                    gray_render_line(worker,local_48,lVar13);
                    goto LAB_0013bbd3;
                  }
                  pcVar12 = pcVar5 + 1;
                  if ((pcVar5[1] & 3U) != 0) break;
                  local_88.x = pPVar9[1].x;
                  local_88.y = pPVar9[1].y;
                  pPVar2 = &pPVar9[2].y;
                  do {
                    pPVar7 = pPVar2;
                    if (pPVar11 <= (PVG_FT_Vector *)(pPVar7 + -3)) {
                      gray_render_conic(worker,&local_88,&local_98);
                      goto LAB_0013bbd3;
                    }
                    local_70.x = ((PVG_FT_Vector *)(pPVar7 + -1))->x;
                    local_70.y = *pPVar7;
                    if ((pcVar12[1] & 3U) == 0) {
                      local_60.x = (local_70.x + local_88.x) / 2;
                      local_60.y = (local_70.y + local_88.y) / 2;
                      gray_render_conic(worker,&local_88,&local_60);
                      local_88.x = local_70.x;
                      local_88.y = local_70.y;
                      iVar3 = 10;
                    }
                    else {
                      iVar3 = 5;
                      if ((pcVar12[1] & 3U) == 1) {
                        gray_render_conic(worker,&local_88,&local_70);
                        iVar3 = 7;
                      }
                    }
                    pcVar12 = pcVar12 + 1;
                    pPVar2 = pPVar7 + 2;
                  } while (iVar3 == 10);
                  lVar8 = local_78;
                  if (iVar3 != 7) goto LAB_0013bbf2;
                  pPVar9 = (PVG_FT_Vector *)(pPVar7 + -1);
                  pcVar5 = pcVar12;
                }
                pPVar10 = pPVar9 + 1;
                if ((pcVar5[1] & 3U) != 1) break;
                gray_render_line(worker,pPVar9[1].x << 2,pPVar9[1].y << 2);
                pPVar9 = pPVar10;
                pcVar5 = pcVar12;
              }
              iVar3 = 5;
              if ((pPVar9 + 2 <= pPVar11) && ((pcVar5[2] & 3U) == 2)) {
                pPVar10 = pPVar9 + 3;
                pcVar12 = pcVar5 + 3;
                local_70.x = pPVar9[1].x;
                local_70.y = pPVar9[1].y;
                local_60.x = pPVar9[2].x;
                local_60.y = pPVar9[2].y;
                if (pPVar11 < pPVar10) {
                  gray_render_cubic(worker,&local_70,&local_60,&local_98);
                  iVar3 = 0xb;
                }
                else {
                  local_40.x = pPVar9[3].x;
                  local_40.y = pPVar9[3].y;
                  gray_render_cubic(worker,&local_70,&local_60,&local_40);
                  iVar3 = 7;
                }
              }
              pPVar9 = pPVar10;
              pcVar5 = pcVar12;
            } while (iVar3 == 7);
            lVar8 = local_78;
            if (iVar3 == 0xb) {
LAB_0013bbd3:
              uVar4 = (int)local_50 + 1;
              iVar3 = 0;
              lVar8 = local_78;
            }
          }
        }
LAB_0013bbf2:
        local_a0 = 0;
        if (iVar3 != 0) {
          if (iVar3 == 5) {
            local_a0 = -1;
          }
          break;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (worker->outline).n_contours);
    }
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
  }
  else {
    local_a0 = -4;
  }
  return local_a0;
}

Assistant:

static int
  gray_convert_glyph_inner( RAS_ARG )
  {
    volatile int  error = 0;

    if ( pvg_ft_setjmp( ras.jump_buffer ) == 0 )
    {
      error = PVG_FT_Outline_Decompose( &ras.outline, &ras );
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );
    }
    else
    {
      error = ErrRaster_Memory_Overflow;
    }

    return error;
  }